

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<double,_4,_3> *
tcu::operator*(Matrix<double,_4,_3> *__return_storage_ptr__,Matrix<double,_4,_1> *a,
              Matrix<double,_1,_3> *b)

{
  double dVar1;
  int row;
  long lVar2;
  double *pdVar3;
  long lVar4;
  
  Matrix<double,_4,_3>::Matrix(__return_storage_ptr__);
  pdVar3 = (double *)__return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    dVar1 = (a->m_data).m_data[0].m_data[lVar2];
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
      *(double *)((long)pdVar3 + lVar4 * 4) =
           *(double *)((long)(b->m_data).m_data[0].m_data + lVar4) * dVar1 + 0.0;
    }
    pdVar3 = pdVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}